

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void google::protobuf::compiler::objectivec::anon_unknown_0::
     CollectMinimalFileDepsContainingExtensions
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *files)

{
  int iVar1;
  FileDescriptor *file_00;
  FileDescriptor *dep;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files_visited;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_local;
  FileDescriptor *file_local;
  
  files_visited._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)files;
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         *)local_48);
  local_4c = 0;
  while( true ) {
    iVar1 = FileDescriptor::dependency_count(file);
    if (iVar1 <= local_4c) break;
    file_00 = FileDescriptor::dependency(file,local_4c);
    CollectMinimalFileDepsContainingExtensionsWorker
              (file_00,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)files_visited._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)local_48);
    local_4c = local_4c + 1;
  }
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *)local_48);
  return;
}

Assistant:

void CollectMinimalFileDepsContainingExtensions(
    const FileDescriptor* file,
    std::vector<const FileDescriptor*>* files) {
  std::set<const FileDescriptor*> files_visited;
  for (int i = 0; i < file->dependency_count(); i++) {
    const FileDescriptor* dep = file->dependency(i);
    CollectMinimalFileDepsContainingExtensionsWorker(dep, files,
                                                     &files_visited);
  }
}